

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O3

bool basisu::read_file_to_vec(char *pFilename,uint8_vec *data)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  ulong __n;
  size_t sVar3;
  bool bVar4;
  uint32_t min_new_capacity;
  
  __stream = fopen(pFilename,"rb");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  bVar4 = false;
  fseek(__stream,0,2);
  __n = ftello(__stream);
  if (-1 < (long)__n) {
    fseek(__stream,0,0);
    if (__n >> 0x20 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x231,
                    "bool basisu::vector<unsigned char>::try_resize(size_t, bool) [T = unsigned char]"
                   );
    }
    uVar2 = data->m_size;
    min_new_capacity = (uint32_t)__n;
    if (uVar2 != min_new_capacity) {
      if (uVar2 <= min_new_capacity) {
        if (data->m_capacity < min_new_capacity) {
          bVar4 = false;
          bVar1 = elemental_vector::increase_capacity
                            ((elemental_vector *)data,min_new_capacity,uVar2 + 1 == min_new_capacity
                             ,1,(object_mover)0x0,true);
          if (!bVar1) goto LAB_0021e9a2;
          uVar2 = data->m_size;
        }
        memset(data->m_p + uVar2,0,(ulong)(min_new_capacity - uVar2));
      }
      data->m_size = min_new_capacity;
    }
    if ((__n == 0) || (sVar3 = fread(data->m_p,1,__n,__stream), sVar3 == __n)) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
LAB_0021e9a2:
  fclose(__stream);
  return bVar4;
}

Assistant:

bool read_file_to_vec(const char* pFilename, uint8_vec& data)
	{
		FILE* pFile = nullptr;
#ifdef _WIN32
		fopen_s(&pFile, pFilename, "rb");
#else
		pFile = fopen(pFilename, "rb");
#endif
		if (!pFile)
			return false;
				
		fseek(pFile, 0, SEEK_END);
#ifdef _WIN32
		int64_t filesize = _ftelli64(pFile);
#else
		int64_t filesize = ftello(pFile);
#endif
		if (filesize < 0)
		{
			fclose(pFile);
			return false;
		}
		fseek(pFile, 0, SEEK_SET);

		if (sizeof(size_t) == sizeof(uint32_t))
		{
			if (filesize > 0x70000000)
			{
				// File might be too big to load safely in one alloc
				fclose(pFile);
				return false;
			}
		}

		if (!data.try_resize((size_t)filesize))
		{
			fclose(pFile);
			return false;
		}

		if (filesize)
		{
			if (fread(&data[0], 1, (size_t)filesize, pFile) != (size_t)filesize)
			{
				fclose(pFile);
				return false;
			}
		}

		fclose(pFile);
		return true;
	}